

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::Length(VirtualMachine *this)

{
  element_type *peVar1;
  size_type val;
  Variable VVar2;
  string local_40;
  allocator<char> local_19;
  
  VVar2 = popOpStack(this);
  switch(VVar2.type) {
  case Undefined:
  case Integer:
  case Boolean:
  case Float:
  case Function:
    pushUndefined(this);
    goto LAB_001186b6;
  case String:
    val = (VVar2.field_1.stringValue)->_M_string_length;
    break;
  case Object:
    val = ((VVar2.field_1.objectValue)->properties)._M_h._M_element_count;
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unknown varible type at variableEquals",&local_19);
    panic(this,&local_40);
  }
  pushInteger(this,val);
LAB_001186b6:
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Length() {
  Variable top = this->popOpStack();

  switch (top.type) {
    case VariableType::Integer: {
      this->pushUndefined();
      break;
    }
    case VariableType::Float: {
      this->pushUndefined();
      break;
    }
    case VariableType::Function: {
      this->pushUndefined();
      break;
    }
    case VariableType::Object: {
      this->pushInteger(top.objectValue->properties.size());
      break;
    }
    case VariableType::String: {
      this->pushInteger(top.stringValue->size());
      break;
    }
    case VariableType::Undefined: {
      this->pushUndefined();
      break;
    }
    case VariableType::Boolean: {
      this->pushUndefined();
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->advance();
}